

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

void __thiscall QHostAddress::setAddress(QHostAddress *this,SpecialAddress address)

{
  long lVar1;
  quint8 qVar2;
  QHostAddressPrivate *pQVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QExplicitlySharedDataPointer<QHostAddressPrivate>::detach_helper(&this->d);
    pQVar3 = (this->d).d.ptr;
  }
  pQVar3->a = 0;
  pQVar3->protocol = -1;
  (pQVar3->field_1).a6_64.c[0] = 0;
  (pQVar3->field_1).a6_64.c[1] = 0;
  qVar2 = '\0';
  uVar4 = 0xffffffff;
  switch(address) {
  case Null:
    break;
  case LocalHost:
    uVar4 = 0x7f000001;
  case Broadcast:
    pQVar3 = (this->d).d.ptr;
    pQVar3->a = uVar4;
    pQVar3->protocol = '\0';
    (pQVar3->field_1).a6_64.c[0] = 0;
    (pQVar3->field_1).a6_32.c[2] = 0xffff0000;
    (pQVar3->field_1).a6_32.c[3] =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    break;
  case LocalHostIPv6:
    qVar2 = '\x01';
  case AnyIPv6:
    pQVar3 = (this->d).d.ptr;
    pQVar3->protocol = '\x01';
    (pQVar3->field_1).a6_64.c[0] = 0;
    *(undefined8 *)((long)(pQVar3->field_1).a6_64.c + 7) = 0;
    (pQVar3->field_1).a6.c[0xf] = qVar2;
    pQVar3->a = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      convertToIpv4(&pQVar3->a,&(pQVar3->field_1).a6,(ConversionMode)0x5);
      return;
    }
    goto LAB_001ac363;
  case Any:
    ((this->d).d.ptr)->protocol = '\x02';
    break;
  default:
    pQVar3 = (this->d).d.ptr;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      (pQVar3->field_1).a6_64.c[0] = 0;
      (pQVar3->field_1).a6_64.c[1] = 0;
      *(undefined8 *)((long)(pQVar3->field_1).a6_64.c + 0xd) = 0;
      return;
    }
    goto LAB_001ac363;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_001ac363:
  __stack_chk_fail();
}

Assistant:

void QHostAddress::setAddress(SpecialAddress address)
{
    clear();

    Q_IPV6ADDR ip6;
    memset(&ip6, 0, sizeof ip6);
    quint32 ip4 = INADDR_ANY;

    switch (address) {
    case Null:
        return;

    case Broadcast:
        ip4 = INADDR_BROADCAST;
        break;
    case LocalHost:
        ip4 = INADDR_LOOPBACK;
        break;
    case AnyIPv4:
        break;

    case LocalHostIPv6:
        ip6[15] = 1;
        Q_FALLTHROUGH();
    case AnyIPv6:
        d->setAddress(ip6);
        return;

    case Any:
        d->protocol = QHostAddress::AnyIPProtocol;
        return;
    }

    // common IPv4 part
    d->setAddress(ip4);
}